

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

string * __thiscall
gmlc::utilities::stringOps::removeChar_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view source,char remchar)

{
  stringOps *psVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(size_type)this);
  if (this != (stringOps *)0x0) {
    psVar1 = (stringOps *)0x0;
    do {
      if (psVar1[source._M_len] != source._M_str._0_1_) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char)psVar1[source._M_len]);
      }
      psVar1 = psVar1 + 1;
    } while (this != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string removeChar(std::string_view source, char remchar)
    {
        std::string result;
        result.reserve(source.length());
        std::remove_copy(
            source.begin(), source.end(), std::back_inserter(result), remchar);
        return result;
    }